

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.h
# Opt level: O2

void ReadVectorFromFile<int>(FILE *file_ptr,vector<int,_std::allocator<int>_> *vec)

{
  ostream *poVar1;
  Logger *this;
  allocator local_69;
  Logger local_68;
  allocator local_61;
  size_t len;
  string local_58;
  string local_38;
  
  if (file_ptr == (FILE *)0x0) {
    len = CONCAT44(len._4_4_,2);
    std::__cxx11::string::string
              ((string *)&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
               ,(allocator *)&local_68);
    std::__cxx11::string::string((string *)&local_38,"ReadVectorFromFile",&local_69);
    poVar1 = Logger::Start(ERR,&local_58,0x11c,&local_38);
    poVar1 = std::operator<<(poVar1,"CHECK failed ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x11c);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"file_ptr");
    std::operator<<(poVar1," == NULL \n");
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    this = (Logger *)&len;
  }
  else {
    len = 0;
    ReadDataFromDisk(file_ptr,(char *)&len,8);
    if (len != 0) {
      local_58._M_dataplus._M_p =
           (pointer)(vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
      local_58._M_string_length =
           (size_type)
           (vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      local_58.field_2._M_allocated_capacity =
           (size_type)
           (vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
      (vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      (vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
           = (pointer)SUB168(ZEXT816(0) << 0x20,0);
      (vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
           = (pointer)SUB168(ZEXT816(0) << 0x20,8);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_58);
      std::vector<int,_std::allocator<int>_>::resize(vec,len);
      ReadDataFromDisk(file_ptr,(char *)(vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                        .super__Vector_impl_data._M_start,len << 2);
      return;
    }
    local_68.severity_ = ERR;
    std::__cxx11::string::string
              ((string *)&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
               ,&local_69);
    std::__cxx11::string::string((string *)&local_38,"ReadVectorFromFile",&local_61);
    poVar1 = Logger::Start(ERR,&local_58,0x120,&local_38);
    poVar1 = std::operator<<(poVar1,"CHECK_GT failed ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x120);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"len");
    poVar1 = std::operator<<(poVar1," = ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"0");
    poVar1 = std::operator<<(poVar1," = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
    std::operator<<(poVar1,"\n");
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    this = &local_68;
  }
  Logger::~Logger(this);
  abort();
}

Assistant:

void ReadVectorFromFile(FILE *file_ptr, std::vector<T> &vec) {
  CHECK_NOTNULL(file_ptr);
  // First, read the length of vector
  size_t len = 0;
  ReadDataFromDisk(file_ptr, reinterpret_cast<char *>(&len), sizeof(len));
  CHECK_GT(len, 0);
  // Clear the original vector
  std::vector<T>().swap(vec);
  vec.resize(len);
  ReadDataFromDisk(file_ptr, reinterpret_cast<char *>(vec.data()), sizeof(T)*len);
}